

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O3

int __thiscall dic::rehash(dic *this,int dictidx)

{
  long lVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  void *pvVar5;
  long lVar6;
  undefined8 *puVar7;
  long lVar8;
  void *key;
  int iVar9;
  int dictidx_00;
  dictht *ht;
  ulong uVar10;
  dic *this_00;
  undefined8 *puVar11;
  pointer pdVar12;
  double dVar13;
  
  pdVar12 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
            super__Vector_impl_data._M_start;
  (pdVar12[dictidx].type)->hashFunction = murmurhash2;
  uVar10 = pdVar12[dictidx].ht[0].size * 2;
  if (uVar10 < 3) {
    *(unsigned_long *)((long)(pdVar12[dictidx].ht + 1) + 8) = 2;
    *(unsigned_long *)((long)(pdVar12[dictidx].ht + 1) + 0x10) = 1;
    uVar10 = 0x10;
  }
  else {
    iVar9 = 2;
    do {
      dVar13 = exp2((double)iVar9);
      uVar4 = (long)(dVar13 - 9.223372036854776e+18) & (long)dVar13 >> 0x3f | (long)dVar13;
      iVar9 = iVar9 + 1;
    } while (uVar4 < uVar10);
    pdVar12 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
              super__Vector_impl_data._M_start;
    *(ulong *)((long)(pdVar12[dictidx].ht + 1) + 8) = uVar4;
    *(ulong *)((long)(pdVar12[dictidx].ht + 1) + 0x10) = uVar4 - 1;
    uVar10 = -(ulong)(uVar4 >> 0x3d != 0) | uVar4 << 3;
  }
  pvVar5 = operator_new__(uVar10);
  pdVar12[dictidx].ht[1].table = (dictEntry **)pvVar5;
  if (pdVar12[dictidx].ht[0].size != 0) {
    uVar10 = 0;
    do {
      puVar11 = *(undefined8 **)((long)pdVar12[dictidx].ht[0].table + uVar10 * 8);
      if (puVar11 != (undefined8 *)0x0) {
        do {
          uVar3 = (*((this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
                     super__Vector_impl_data._M_start[dictidx].type)->hashFunction)(*puVar11);
          pdVar12 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar8 = (long)pdVar12[dictidx].ht[1].table;
          lVar6 = (long)(int)(uVar3 & *(uint *)((long)(pdVar12[dictidx].ht + 1) + 0x10));
          lVar1 = *(long *)(lVar8 + lVar6 * 8);
          if (lVar1 == 0) {
            puVar7 = (undefined8 *)(lVar8 + lVar6 * 8);
          }
          else {
            do {
              lVar8 = lVar1;
              lVar1 = *(long *)(lVar8 + 0x10);
            } while (lVar1 != 0);
            puVar7 = (undefined8 *)(lVar8 + 0x10);
          }
          *puVar7 = puVar11;
          puVar11 = (undefined8 *)puVar11[2];
        } while (puVar11 != (undefined8 *)0x0);
        pdVar12 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (uVar10 < pdVar12[dictidx].ht[0].size);
  }
  if (pdVar12[dictidx].ht[0].size != 0) {
    uVar10 = 0;
    do {
      pvVar5 = *(void **)((long)pdVar12[dictidx].ht[0].table + uVar10 * 8);
      if (pvVar5 != (void *)0x0) {
        do {
          pvVar2 = *(void **)((long)pvVar5 + 0x10);
          operator_delete(pvVar5);
          pvVar5 = pvVar2;
        } while (pvVar2 != (void *)0x0);
        pdVar12 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (uVar10 < pdVar12[dictidx].ht[0].size);
  }
  ht = pdVar12[dictidx].ht + 1;
  this_00 = (dic *)pdVar12[dictidx].ht;
  dictht::operator=((dictht *)this_00,ht);
  dictidx_00 = (int)ht;
  iVar9 = (this_00->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
          super__Vector_impl_data._M_start[dictidx_00].rehashidx;
  pvVar5 = dict_find(this_00,dictidx_00,0,key);
  if (iVar9 != -1) {
    if (pvVar5 != (void *)0x0) goto LAB_00106d4e;
    pvVar5 = dict_find(this_00,dictidx_00,1,key);
  }
  if (pvVar5 == (void *)0x0) {
    return 0;
  }
LAB_00106d4e:
  return (int)*(undefined8 *)((long)pvVar5 + 8);
}

Assistant:

int dic::rehash(int dictidx){
    int i=1,index;
    dictEntry *tmp=NULL;
    dc[dictidx].type->hashFunction=dic::murmurhash2;
    unsigned long newsize=dc[dictidx].ht[0].size*2;
    unsigned long tmpsize=pow(2,i);
    while(newsize>tmpsize){
        tmpsize=pow(2,++i);
    }
    newsize=tmpsize;

    dc[dictidx].ht[1].size=newsize;
    dc[dictidx].ht[1].sizemask=newsize-1;
    dc[dictidx].ht[1].table=new dictEntry*[newsize];

    dictEntry *fetch=NULL;
    for(unsigned int i=0;i<dc[dictidx].ht[0].size;i++){
        fetch=dc[dictidx].ht[0].table[i];
        while(fetch!=NULL){
            index=dc[dictidx].type->hashFunction(fetch->key)&dc[dictidx].ht[1].sizemask;
            tmp=dc[dictidx].ht[1].table[index];
            if(tmp==NULL)
                dc[dictidx].ht[1].table[index]=fetch;
            else
            {
                while(tmp->next!=NULL){
                    tmp=tmp->next;
                }
                tmp->next=fetch;
            }
            fetch=fetch->next;
        }
    }
    //ht[0] -> ht[1] done

    //relese ht[0]
    fetch=tmp=NULL;    
    for(unsigned int i=0;i<dc[dictidx].ht[0].size;i++){
        fetch=dc[dictidx].ht[0].table[i];
        while(fetch!=NULL){
            tmp=fetch;
            fetch=fetch->next;
            delete tmp;
            tmp=NULL;
        }
    }  

    //override =
    dc[dictidx].ht[0]=dc[dictidx].ht[1];


    dictht *newht=NULL;
    newht->table=NULL;
    newht->size=0;
    newht->sizemask=0;
    newht->used=0;
    dc[dictidx].ht[1]=*newht;

    return 1;
}